

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O1

double Js::JavascriptDate::TimeClip(Var x)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double x_00;
  double dVar4;
  
  if (((ulong)x & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)x & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00bc3f05;
    *puVar3 = 0;
  }
  if (((ulong)x & 0xffff000000000000) == 0x1000000000000) {
    x_00 = (double)(int)x;
  }
  else {
    if ((ulong)x >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                  ,0xe7,"(JavascriptNumber::Is(x))","JavascriptNumber::Is(x)");
      if (!bVar2) {
LAB_00bc3f05:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00bc3f05;
      *puVar3 = 0;
    }
    bVar2 = NumberUtilities::IsFinite((double)((ulong)x ^ 0xfffc000000000000));
    if (!bVar2) {
      return NAN;
    }
    x_00 = JavascriptConversion::ToInteger((double)((ulong)x ^ 0xfffc000000000000));
  }
  dVar4 = Math::Abs(x_00);
  if (8.64e+15 < dVar4) {
    return NAN;
  }
  return x_00;
}

Assistant:

double JavascriptDate::TimeClip(Var x)
    {
        double time = 0.0;
        if (TaggedInt::Is(x))
        {
            time = TaggedInt::ToDouble(x);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(x));
            time = JavascriptNumber::GetValue(x);

            // Only perform steps 1, 3, and 4 if the input was not a TaggedInt, since TaggedInts cant be infinite or -0
            if (!NumberUtilities::IsFinite(time))
            {
                return NumberConstants::NaN;
            }

            // This performs both steps 3 and 4
            time = JavascriptConversion::ToInteger(time);
        }

        // Step 2: If abs(time) > 8.64e15, return NaN.
        if (Math::Abs(time) > 8.64e15)
        {
            return NumberConstants::NaN;
        }

        return time;
    }